

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void jinit_color_deconverter(j_decompress_ptr cinfo)

{
  J_COLOR_SPACE JVar1;
  jpeg_error_mgr *pjVar2;
  int iVar3;
  jpeg_color_deconverter *pjVar4;
  ulong uVar5;
  code *pcVar6;
  _func_void_j_decompress_ptr *p_Var7;
  long lVar8;
  undefined1 *puVar9;
  long lVar10;
  undefined1 *puVar11;
  int iVar12;
  undefined1 *puVar13;
  
  iVar12 = 1;
  pjVar4 = (jpeg_color_deconverter *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x38);
  cinfo->cconvert = pjVar4;
  pjVar4->start_pass = start_pass_dcolor;
  JVar1 = cinfo->jpeg_color_space;
  if (JVar1 - JCS_RGB < 2) {
    if (cinfo->num_components != 3) goto LAB_00117a4a;
  }
  else if (JVar1 - JCS_CMYK < 2) {
    if (cinfo->num_components != 4) goto LAB_00117a4a;
  }
  else if (JVar1 == JCS_GRAYSCALE) {
    if (cinfo->num_components != 1) {
LAB_00117a4a:
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 10;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
  }
  else if (cinfo->num_components < 1) goto LAB_00117a4a;
  JVar1 = cinfo->out_color_space;
  uVar5 = (ulong)JVar1;
  switch(JVar1) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    JVar1 = cinfo->jpeg_color_space;
    if (JVar1 != JCS_YCbCr) {
      if (JVar1 == JCS_RGB) {
        pjVar4->color_convert = rgb_gray_convert;
        pjVar4 = cinfo->cconvert;
        p_Var7 = (_func_void_j_decompress_ptr *)
                 (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x1800);
        pjVar4[3].start_pass = p_Var7;
        pcVar6 = p_Var7 + 0x1000;
        puVar11 = (undefined1 *)0x0;
        puVar13 = (undefined1 *)0x0;
        for (puVar9 = (undefined1 *)0x8000; puVar9 != (undefined1 *)0x1daf00;
            puVar9 = &F_0_114 + (long)puVar9) {
          *(undefined1 **)(pcVar6 + -0x1000) = puVar11;
          *(undefined1 **)(pcVar6 + -0x800) = puVar13;
          *(undefined1 **)pcVar6 = puVar9;
          pcVar6 = pcVar6 + 8;
          puVar13 = &F_0_587 + (long)puVar13;
          puVar11 = &F_0_299 + (long)puVar11;
        }
        goto LAB_00117c26;
      }
      if (JVar1 != JCS_GRAYSCALE) break;
    }
    pjVar4->color_convert = grayscale_convert;
    iVar3 = cinfo->num_components;
    lVar10 = 0x90;
    for (lVar8 = 1; lVar8 < iVar3; lVar8 = lVar8 + 1) {
      *(undefined4 *)((long)&cinfo->comp_info->component_id + lVar10) = 0;
      lVar10 = lVar10 + 0x60;
    }
    goto LAB_00117c26;
  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
    cinfo->out_color_components = rgb_pixelsize[uVar5];
    JVar1 = cinfo->jpeg_color_space;
    if (JVar1 == JCS_GRAYSCALE) {
      pcVar6 = gray_rgb_convert;
    }
    else if (JVar1 == JCS_RGB) {
      if ((((0x10c4UL >> (uVar5 & 0x3f) & 1) != 0) && ((0x33c4UL >> (uVar5 & 0x3f) & 1) != 0)) &&
         ((0x144UL >> (uVar5 & 0x3f) & 1) != 0)) goto LAB_00117bdd;
      pcVar6 = rgb_rgb_convert;
    }
    else {
      if (JVar1 != JCS_YCbCr) break;
      iVar3 = jsimd_can_ycc_rgb();
      if (iVar3 == 0) {
        pcVar6 = ycc_rgb_convert;
        goto LAB_00117bc1;
      }
      pcVar6 = jsimd_ycc_rgb_convert;
    }
    goto LAB_00117be4;
  default:
    if (JVar1 == cinfo->jpeg_color_space) {
      cinfo->out_color_components = cinfo->num_components;
LAB_00117bdd:
      pcVar6 = null_convert;
      goto LAB_00117be4;
    }
    break;
  case JCS_CMYK:
    cinfo->out_color_components = 4;
    if (cinfo->jpeg_color_space == JCS_CMYK) goto LAB_00117bdd;
    if (cinfo->jpeg_color_space == JCS_YCCK) {
      pcVar6 = ycck_cmyk_convert;
LAB_00117bc1:
      pjVar4->color_convert = pcVar6;
      build_ycc_rgb_table(cinfo);
      goto LAB_00117c26;
    }
    break;
  case JCS_RGB565:
    cinfo->out_color_components = 3;
    JVar1 = cinfo->jpeg_color_space;
    if (cinfo->dither_mode == JDITHER_NONE) {
      if (JVar1 == JCS_GRAYSCALE) {
        pcVar6 = gray_rgb565_convert;
      }
      else if (JVar1 == JCS_RGB) {
        pcVar6 = rgb_rgb565_convert;
      }
      else {
        if (JVar1 != JCS_YCbCr) break;
        iVar3 = jsimd_can_ycc_rgb565();
        if (iVar3 == 0) {
          pcVar6 = ycc_rgb565_convert;
          goto LAB_00117bc1;
        }
        pcVar6 = jsimd_ycc_rgb565_convert;
      }
    }
    else if (JVar1 == JCS_GRAYSCALE) {
      pcVar6 = gray_rgb565D_convert;
    }
    else {
      if (JVar1 != JCS_RGB) {
        if (JVar1 == JCS_YCbCr) {
          pcVar6 = ycc_rgb565D_convert;
          goto LAB_00117bc1;
        }
        break;
      }
      pcVar6 = rgb_rgb565D_convert;
    }
LAB_00117be4:
    pjVar4->color_convert = pcVar6;
    goto LAB_00117c26;
  }
  pjVar2 = cinfo->err;
  pjVar2->msg_code = 0x1b;
  (*pjVar2->error_exit)((j_common_ptr)cinfo);
LAB_00117c26:
  if (cinfo->quantize_colors == 0) {
    iVar12 = cinfo->out_color_components;
  }
  cinfo->output_components = iVar12;
  return;
}

Assistant:

GLOBAL(void)
jinit_color_deconverter(j_decompress_ptr cinfo)
{
  my_cconvert_ptr cconvert;
  int ci;

  cconvert = (my_cconvert_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_color_deconverter));
  cinfo->cconvert = (struct jpeg_color_deconverter *)cconvert;
  cconvert->pub.start_pass = start_pass_dcolor;

  /* Make sure num_components agrees with jpeg_color_space */
  switch (cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  case JCS_RGB:
  case JCS_YCbCr:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  default:                      /* JCS_UNKNOWN can be anything */
    if (cinfo->num_components < 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;
  }

  /* Set out_color_components and conversion method based on requested space.
   * Also clear the component_needed flags for any unused components,
   * so that earlier pipeline stages can avoid useless computation.
   */

  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    if (cinfo->jpeg_color_space == JCS_GRAYSCALE ||
        cinfo->jpeg_color_space == JCS_YCbCr) {
      cconvert->pub.color_convert = grayscale_convert;
      /* For color->grayscale conversion, only the Y (0) component is needed */
      for (ci = 1; ci < cinfo->num_components; ci++)
        cinfo->comp_info[ci].component_needed = FALSE;
    } else if (cinfo->jpeg_color_space == JCS_RGB) {
      cconvert->pub.color_convert = rgb_gray_convert;
      build_rgb_y_table(cinfo);
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
    cinfo->out_color_components = rgb_pixelsize[cinfo->out_color_space];
    if (cinfo->jpeg_color_space == JCS_YCbCr) {
      if (jsimd_can_ycc_rgb())
        cconvert->pub.color_convert = jsimd_ycc_rgb_convert;
      else {
        cconvert->pub.color_convert = ycc_rgb_convert;
        build_ycc_rgb_table(cinfo);
      }
    } else if (cinfo->jpeg_color_space == JCS_GRAYSCALE) {
      cconvert->pub.color_convert = gray_rgb_convert;
    } else if (cinfo->jpeg_color_space == JCS_RGB) {
      if (rgb_red[cinfo->out_color_space] == 0 &&
          rgb_green[cinfo->out_color_space] == 1 &&
          rgb_blue[cinfo->out_color_space] == 2 &&
          rgb_pixelsize[cinfo->out_color_space] == 3)
        cconvert->pub.color_convert = null_convert;
      else
        cconvert->pub.color_convert = rgb_rgb_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB565:
    cinfo->out_color_components = 3;
    if (cinfo->dither_mode == JDITHER_NONE) {
      if (cinfo->jpeg_color_space == JCS_YCbCr) {
        if (jsimd_can_ycc_rgb565())
          cconvert->pub.color_convert = jsimd_ycc_rgb565_convert;
        else {
          cconvert->pub.color_convert = ycc_rgb565_convert;
          build_ycc_rgb_table(cinfo);
        }
      } else if (cinfo->jpeg_color_space == JCS_GRAYSCALE) {
        cconvert->pub.color_convert = gray_rgb565_convert;
      } else if (cinfo->jpeg_color_space == JCS_RGB) {
        cconvert->pub.color_convert = rgb_rgb565_convert;
      } else
        ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    } else {
      /* only ordered dithering is supported */
      if (cinfo->jpeg_color_space == JCS_YCbCr) {
        cconvert->pub.color_convert = ycc_rgb565D_convert;
        build_ycc_rgb_table(cinfo);
      } else if (cinfo->jpeg_color_space == JCS_GRAYSCALE) {
        cconvert->pub.color_convert = gray_rgb565D_convert;
      } else if (cinfo->jpeg_color_space == JCS_RGB) {
        cconvert->pub.color_convert = rgb_rgb565D_convert;
      } else
        ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    }
    break;

  case JCS_CMYK:
    cinfo->out_color_components = 4;
    if (cinfo->jpeg_color_space == JCS_YCCK) {
      cconvert->pub.color_convert = ycck_cmyk_convert;
      build_ycc_rgb_table(cinfo);
    } else if (cinfo->jpeg_color_space == JCS_CMYK) {
      cconvert->pub.color_convert = null_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  default:
    /* Permit null conversion to same output space */
    if (cinfo->out_color_space == cinfo->jpeg_color_space) {
      cinfo->out_color_components = cinfo->num_components;
      cconvert->pub.color_convert = null_convert;
    } else                      /* unsupported non-null conversion */
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;
  }

  if (cinfo->quantize_colors)
    cinfo->output_components = 1; /* single colormapped output component */
  else
    cinfo->output_components = cinfo->out_color_components;
}